

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

bool ncnn::test_prefer_winograd23(int num_input,int num_output,int w,int h)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  if (h < w) {
    w = h;
  }
  if (num_input < 0x200) {
    if (0xff < num_input) {
      if ((0x1ff < num_output) || (0xff < num_output)) goto LAB_001ea1ea;
      if (0x7f < num_output) {
LAB_001ea1d2:
        return w - 3U < 10;
      }
      if (0x3f < num_output) {
        uVar1 = w - 3;
        goto LAB_001ea3a9;
      }
      goto LAB_001ea268;
    }
    if (num_input < 0x80) {
      if (num_input < 0x40) {
        if (num_input < 0x20) {
          if (num_input < 0x10) {
            if (0x7f < num_output || num_input < 8) {
              return false;
            }
            if (0x3f < num_output) {
              if ((w - 3U < 0xc) && ((0xff3U >> (w - 3U & 0x1f) & 1) != 0)) {
                return true;
              }
              uVar1 = w - 0x2f;
              goto LAB_001ea3a9;
            }
            if (num_output < 0x20) {
              if (num_output < 0x10) {
                return 7 < num_output;
              }
              if ((w - 3U < 0xc) && ((0xfcfU >> (w - 3U & 0x1f) & 1) != 0)) {
                return true;
              }
              return w - 0x2fU < 0xa6;
            }
            bVar2 = w - 3U < 4;
            uVar1 = w - 0xf;
          }
          else {
            if (0x1ff < num_output) {
              uVar1 = w - 0xb;
              goto LAB_001ea3a9;
            }
            if (0xff < num_output) goto LAB_001ea1d2;
            if (0x7f < num_output) {
              bVar2 = w - 3U < 4;
              uVar1 = w - 9;
              goto LAB_001ea33e;
            }
            if (0x3f < num_output) {
              if ((w - 3U < 10) && ((0x333U >> (w - 3U & 0x1f) & 1) != 0)) {
                return true;
              }
              uVar1 = w - 0xf;
              goto LAB_001ea381;
            }
            if (num_output < 0x20) {
              if (0xf < num_output) goto LAB_001ea298;
              if (num_output < 8) {
                return false;
              }
              goto LAB_001ea225;
            }
            bVar2 = w - 3U < 2;
            uVar1 = w - 9;
          }
          goto LAB_001ea252;
        }
        if ((0x1ff < num_output) || (0xff < num_output)) {
          bVar2 = w - 3U < 4;
          goto LAB_001ea24c;
        }
        if (0x7f < num_output) {
          bVar2 = w - 3U < 2;
          uVar1 = w - 7;
LAB_001ea33e:
          bVar3 = uVar1 < 10;
          goto LAB_001ea255;
        }
        if (0x3f < num_output) goto LAB_001ea2de;
        if ((num_output < 0x20) && (num_output < 0x10)) {
          if (num_output < 8) {
            return false;
          }
          goto LAB_001ea298;
        }
      }
      else {
        if (0x1ff < num_output) {
          if ((w - 3U < 10) && ((0x33fU >> (w - 3U & 0x1f) & 1) != 0)) {
            return true;
          }
          uVar1 = w - 0xf;
          goto LAB_001ea2e1;
        }
        if (num_output < 0x100) {
          if (num_output < 0x80) {
            if ((((num_output < 0x40) && (num_output < 0x20)) && (num_output < 0x10)) &&
               (num_output < 8)) {
              return false;
            }
            goto LAB_001ea1d2;
          }
          bVar2 = w - 3U < 6;
          bVar3 = w - 0x13U < 4;
          goto LAB_001ea255;
        }
      }
      uVar1 = w - 7;
LAB_001ea3a9:
      return uVar1 < 2;
    }
    if (0x1ff < num_output) goto LAB_001ea1ea;
    if (0xff < num_output) goto LAB_001ea225;
    if (0x7f < num_output) {
LAB_001ea298:
      return w - 3U < 8;
    }
    if (0x3f < num_output) goto LAB_001ea2de;
    if (0x1f < num_output) goto LAB_001ea298;
    if (num_output < 0x10) goto LAB_001ea272;
  }
  else {
    if (((0x1ff < num_output) || (0xff < num_output)) || (0x7f < num_output)) {
LAB_001ea1ea:
      return w - 3U < 0xc;
    }
    if (0x3f < num_output) {
LAB_001ea225:
      bVar2 = w - 3U < 6;
LAB_001ea24c:
      uVar1 = w - 0xb;
LAB_001ea252:
      bVar3 = uVar1 < 2;
LAB_001ea255:
      return (bool)(bVar3 | bVar2);
    }
LAB_001ea268:
    if ((0x1f < num_output) || (0xf < num_output)) {
LAB_001ea2de:
      uVar1 = w - 3;
LAB_001ea2e1:
      return uVar1 < 6;
    }
LAB_001ea272:
    if (num_output < 8) {
      return false;
    }
  }
  uVar1 = w - 3;
LAB_001ea381:
  return uVar1 < 4;
}

Assistant:

static bool test_prefer_winograd23(int num_input, int num_output, int w, int h)
{
    int minwh = std::min(w, h);

    if (num_input >= 512)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 256)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 128)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 6);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 64)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12) || (minwh >= 15 && minwh <= 20);
        if (num_output >= 256) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 8) || (minwh >= 19 && minwh <= 22);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 12);
        return false;
    }
    if (num_input >= 32)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 6) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 6) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 4) || (minwh >= 7 && minwh <= 16);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 32) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 10);
        return false;
    }
    if (num_input >= 16)
    {
        if (num_output >= 512) return (minwh >= 11 && minwh <= 12);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 6)
                                          || (minwh >= 9 && minwh <= 18);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 7 && minwh <= 8)
                                         || (minwh >= 11 && minwh <= 12)
                                         || (minwh >= 15 && minwh <= 18);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 9 && minwh <= 10);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 8)
                                        || (minwh >= 11 && minwh <= 12);
        return false;
    }
    if (num_input >= 8)
    {
        if (num_output >= 128) return false;
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 7 && minwh <= 14)
                                         || (minwh >= 47 && minwh <= 48);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 6)
                                         || (minwh >= 15 && minwh <= 16);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 6)
                                         || (minwh >= 9 && minwh <= 14)
                                         || (minwh >= 47 && minwh <= 212);
        if (num_output >= 8) return true;
        return false;
    }

    return false;
}